

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O1

void sg_init_buffer(sg_buffer buf_id,sg_buffer_desc *desc)

{
  undefined4 uVar1;
  long lVar2;
  sg_buffer_desc *psVar3;
  sg_buffer_desc desc_def;
  sg_buffer_desc local_60;
  
  if (_sg.valid) {
    psVar3 = &local_60;
    for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
      uVar1 = *(undefined4 *)&desc->field_0x4;
      psVar3->_start_canary = desc->_start_canary;
      *(undefined4 *)&psVar3->field_0x4 = uVar1;
      desc = (sg_buffer_desc *)&desc->size;
      psVar3 = (sg_buffer_desc *)&psVar3->size;
    }
    local_60.type = local_60.type + (local_60.type == _SG_BUFFERTYPE_DEFAULT);
    local_60.usage = local_60.usage + (local_60.usage == _SG_USAGE_DEFAULT);
    if (local_60.size == 0) {
      local_60.size = local_60.data.size;
    }
    else if (local_60.data.size == 0) {
      local_60.data.size = local_60.size;
    }
    _sg_init_buffer(buf_id,&local_60);
    return;
  }
  __assert_fail("_sg.valid",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                ,0x3a49,"void sg_init_buffer(sg_buffer, const sg_buffer_desc *)");
}

Assistant:

inline void sg_init_buffer(sg_buffer buf_id, const sg_buffer_desc& desc) { return sg_init_buffer(buf_id, &desc); }